

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_unary(t_parser *this,bool a_assignable)

{
  t_node *ptVar1;
  t_token tVar2;
  t_at *ptVar3;
  t_literal<double> *this_00;
  t_literal<long> *ptVar4;
  byte in_DL;
  undefined7 in_register_00000031;
  size_t a_indent;
  double local_110;
  double local_f8;
  undefined1 local_90 [16];
  ulong local_80;
  intptr_t value_2;
  double value_1;
  intptr_t value;
  t_at at;
  undefined1 local_38 [20];
  t_instruction instruction;
  size_t indent;
  undefined8 uStack_18;
  bool a_assignable_local;
  t_parser *this_local;
  
  a_indent = CONCAT71(in_register_00000031,a_assignable);
  indent._7_1_ = in_DL & 1;
  uStack_18 = a_indent;
  this_local = this;
  register0x00000000 = (t_node *)t_lexer::f_indent((t_lexer *)(a_indent + 8));
  tVar2 = t_lexer::f_token((t_lexer *)(a_indent + 8));
  ptVar1 = stack0xffffffffffffffd8;
  switch(tVar2) {
  case c_token__EXCLAMATION:
    local_38._12_4_ = 0x37;
    break;
  default:
    f_target((t_parser *)local_38,a_assignable);
    f_action(this,a_indent,
             (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)ptVar1,
             SUB81((t_parser *)local_38,0));
    std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               local_38);
    return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
            )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
              )this;
  case c_token__PLUS:
    local_38._12_4_ = 0x31;
    break;
  case c_token__HYPHEN:
    local_38._12_4_ = 0x34;
    break;
  case c_token__TILDE:
    local_38._12_4_ = 0x3a;
  }
  ptVar3 = t_lexer::f_at((t_lexer *)(a_indent + 8));
  at.v_line = ptVar3->v_column;
  value = ptVar3->v_position;
  at.v_position = ptVar3->v_line;
  t_lexer::f_next((t_lexer *)(a_indent + 8));
  if ((local_38._12_4_ == 0x31) || (local_38._12_4_ == 0x34)) {
    tVar2 = t_lexer::f_token((t_lexer *)(a_indent + 8));
    if (tVar2 == c_token__INTEGER) {
      value_1 = (double)t_lexer::f_integer((t_lexer *)(a_indent + 8));
      t_lexer::f_next((t_lexer *)(a_indent + 8));
      ptVar1 = stack0xffffffffffffffd8;
      ptVar4 = (t_literal<long> *)operator_new(0x28);
      if (local_38._12_4_ == 0x34) {
        local_f8 = (double)-(long)value_1;
      }
      else {
        local_f8 = value_1;
      }
      ast::t_literal<long>::t_literal(ptVar4,(t_at *)&value,(long)local_f8);
      f_action(this,a_indent,ptVar1,SUB81(ptVar4,0));
      return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
              )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                )this;
    }
    if (tVar2 == c_token__FLOAT) {
      value_2 = (intptr_t)t_lexer::f_float((t_lexer *)(a_indent + 8));
      t_lexer::f_next((t_lexer *)(a_indent + 8));
      ptVar1 = stack0xffffffffffffffd8;
      this_00 = (t_literal<double> *)operator_new(0x28);
      if (local_38._12_4_ == 0x34) {
        local_110 = -(double)value_2;
      }
      else {
        local_110 = (double)value_2;
      }
      ast::t_literal<double>::t_literal(this_00,(t_at *)&value,local_110);
      f_action(this,a_indent,ptVar1,SUB81(this_00,0));
      return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
              )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                )this;
    }
  }
  else if ((local_38._12_4_ == 0x3a) &&
          (tVar2 = t_lexer::f_token((t_lexer *)(a_indent + 8)), tVar2 == c_token__INTEGER)) {
    local_80 = t_lexer::f_integer((t_lexer *)(a_indent + 8));
    t_lexer::f_next((t_lexer *)(a_indent + 8));
    ptVar1 = stack0xffffffffffffffd8;
    ptVar4 = (t_literal<long> *)operator_new(0x28);
    ast::t_literal<long>::t_literal(ptVar4,(t_at *)&value,~local_80);
    f_action(this,a_indent,ptVar1,SUB81(ptVar4,0));
    return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
            )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
              )this;
  }
  f_unary((t_parser *)local_90,a_assignable);
  std::
  make_unique<xemmai::ast::t_unary,xemmai::t_at&,xemmai::t_instruction&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
            ((t_at *)(local_90 + 8),(t_instruction *)&value,
             (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
             (local_38 + 0xc));
  std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
  unique_ptr<xemmai::ast::t_unary,std::default_delete<xemmai::ast::t_unary>,void>
            ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
             (unique_ptr<xemmai::ast::t_unary,_std::default_delete<xemmai::ast::t_unary>_> *)
             (local_90 + 8));
  std::unique_ptr<xemmai::ast::t_unary,_std::default_delete<xemmai::ast::t_unary>_>::~unique_ptr
            ((unique_ptr<xemmai::ast::t_unary,_std::default_delete<xemmai::ast::t_unary>_> *)
             (local_90 + 8));
  std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::~unique_ptr
            ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)local_90)
  ;
  return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
         )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_unary(bool a_assignable)
{
	size_t indent = v_lexer.f_indent();
	t_instruction instruction;
	switch (v_lexer.f_token()) {
	case t_lexer::c_token__PLUS:
		instruction = c_instruction__PLUS_T;
		break;
	case t_lexer::c_token__HYPHEN:
		instruction = c_instruction__MINUS_T;
		break;
	case t_lexer::c_token__EXCLAMATION:
		instruction = c_instruction__NOT_T;
		break;
	case t_lexer::c_token__TILDE:
		instruction = c_instruction__COMPLEMENT_T;
		break;
	default:
		return f_action(indent, f_target(a_assignable), a_assignable);
	}
	t_at at = v_lexer.f_at();
	v_lexer.f_next();
	switch (instruction) {
	case c_instruction__PLUS_T:
	case c_instruction__MINUS_T:
		switch (v_lexer.f_token()) {
		case t_lexer::c_token__INTEGER:
			{
				auto value = v_lexer.f_integer();
				v_lexer.f_next();
				return f_action(indent, new ast::t_literal(at, instruction == c_instruction__MINUS_T ? -value : value), a_assignable);
			}
		case t_lexer::c_token__FLOAT:
			{
				auto value = v_lexer.f_float();
				v_lexer.f_next();
				return f_action(indent, new ast::t_literal(at, instruction == c_instruction__MINUS_T ? -value : value), a_assignable);
			}
		}
		break;
	case c_instruction__COMPLEMENT_T:
		if (v_lexer.f_token() == t_lexer::c_token__INTEGER) {
			auto value = v_lexer.f_integer();
			v_lexer.f_next();
			return f_action(indent, new ast::t_literal(at, ~value), a_assignable);
		}
		break;
	}
	return std::make_unique<ast::t_unary>(at, instruction, f_unary(false));
}